

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O2

void __thiscall SymbolData::endFunction(SymbolData *this,int64_t address)

{
  long lVar1;
  long lVar2;
  
  if ((long)this->currentFunction != -1) {
    lVar1 = *(long *)&(this->modules).
                      super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl.
                      super__Vector_impl_data._M_start[this->currentModule].functions.
                      super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl;
    lVar2 = (long)this->currentFunction * 0x10;
    *(int64_t *)(lVar1 + 8 + lVar2) = address - *(long *)(lVar1 + lVar2);
    this->currentFunction = -1;
    return;
  }
  Logger::printError<>(Error,"Not inside a function");
  return;
}

Assistant:

void SymbolData::endFunction(int64_t address)
{
	if (currentFunction == -1)
	{
		Logger::printError(Logger::Error, "Not inside a function");
		return;
	}

	SymDataFunction& func = modules[currentModule].functions[currentFunction];
	func.size = (size_t) (address-func.address);
	currentFunction = -1;
}